

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O3

void jinit_1pass_quantizer(j_decompress_ptr cinfo)

{
  uint uVar1;
  jpeg_error_mgr *pjVar2;
  bool bVar3;
  jpeg_color_quantizer *pjVar4;
  ulong uVar5;
  JSAMPARRAY ppJVar6;
  ulong uVar7;
  long lVar8;
  jpeg_error_mgr *pjVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  JDIMENSION JVar14;
  bool bVar15;
  JDIMENSION JVar16;
  JDIMENSION JVar17;
  long lVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  int iVar21;
  uint uVar22;
  uint uVar24;
  uint uVar25;
  int iVar26;
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar31;
  undefined1 auVar29 [16];
  uint uVar32;
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  uint uVar34;
  uint uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  pjVar4 = (jpeg_color_quantizer *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x98);
  cinfo->cquantize = pjVar4;
  pjVar4->start_pass = start_pass_1_quant;
  pjVar4->finish_pass = finish_pass_1_quant;
  pjVar4->new_color_map = new_color_map_1_quant;
  pjVar4[3].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar4[2].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  if (4 < cinfo->out_color_components) {
    *(undefined8 *)&cinfo->err->msg_code = 0x400000039;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar13 = cinfo->desired_number_of_colors;
  if (0x100 < iVar13) {
    *(undefined8 *)&cinfo->err->msg_code = 0x1000000003b;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    iVar13 = cinfo->desired_number_of_colors;
  }
  pjVar4 = cinfo->cquantize;
  uVar1 = cinfo->out_color_components;
  lVar18 = (long)iVar13;
  uVar10 = 1;
  do {
    uVar5 = uVar10;
    uVar10 = uVar5 + 1;
    uVar7 = uVar10;
    iVar13 = uVar1 - 1;
    if (1 < (int)uVar1) {
      do {
        uVar7 = uVar7 * uVar10;
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
  } while ((long)uVar7 <= lVar18);
  if (uVar5 < 2) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3a;
    (pjVar2->msg_parm).i[0] = (int)uVar7;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  auVar23 = _DAT_002ef930;
  if ((int)uVar1 < 1) {
    JVar17 = 1;
  }
  else {
    lVar8 = (ulong)uVar1 - 1;
    auVar20._8_4_ = (int)lVar8;
    auVar20._0_8_ = lVar8;
    auVar20._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar19 = (undefined4)uVar5;
    lVar8 = 0;
    auVar20 = auVar20 ^ _DAT_002ef930;
    auVar27 = _DAT_003064c0;
    auVar28 = _DAT_002f57d0;
    auVar29 = _DAT_003112c0;
    do {
      auVar36 = auVar29;
      auVar29 = auVar28 ^ auVar23;
      uVar22 = -(uint)(auVar20._0_4_ < auVar29._0_4_);
      iVar13 = auVar20._4_4_;
      uVar24 = -(uint)(iVar13 < auVar29._4_4_);
      uVar25 = -(uint)(auVar20._8_4_ < auVar29._8_4_);
      iVar21 = auVar20._12_4_;
      iVar26 = -(uint)(iVar21 < auVar29._12_4_);
      uVar31 = -(uint)(auVar29._4_4_ == iVar13);
      uVar32 = -(uint)(auVar29._12_4_ == iVar21);
      if ((~(uVar24 | uVar31 & uVar22) & 1) != 0) {
        *(undefined4 *)((long)&pjVar4[1].new_color_map + lVar8 + 4) = uVar19;
      }
      if (((((ushort)iVar26 | (ushort)uVar32 & (ushort)uVar25) ^ 0xffff) & 1) != 0) {
        *(undefined4 *)((long)&pjVar4[2].start_pass + lVar8) = uVar19;
      }
      auVar29 = auVar27 ^ auVar23;
      auVar33._0_4_ = -(uint)(auVar20._0_4_ < auVar29._0_4_);
      auVar33._4_4_ = -(uint)(iVar13 < auVar29._4_4_);
      auVar33._8_4_ = -(uint)(auVar20._8_4_ < auVar29._8_4_);
      auVar33._12_4_ = -(uint)(iVar21 < auVar29._12_4_);
      uVar34 = -(uint)(auVar29._4_4_ == iVar13);
      uVar35 = -(uint)(auVar29._12_4_ == iVar21);
      auVar40._4_4_ = uVar34;
      auVar40._0_4_ = uVar34;
      auVar40._8_4_ = uVar35;
      auVar40._12_4_ = uVar35;
      auVar37._4_4_ = auVar33._4_4_;
      auVar37._0_4_ = auVar33._4_4_;
      auVar37._8_4_ = auVar33._12_4_;
      auVar37._12_4_ = auVar33._12_4_;
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar38 = (auVar37 | auVar40 & auVar33) ^ auVar38;
      if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined4 *)((long)&pjVar4[2].start_pass + lVar8 + 4) = uVar19;
      }
      if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined4 *)((long)&pjVar4[2].color_quantize + lVar8) = uVar19;
      }
      auVar29._0_4_ = (undefined4)((ulong)auVar36._0_4_ * (uVar5 & 0xffffffff));
      auVar39._8_4_ = (undefined4)((auVar36._8_8_ & 0xffffffff) * (uVar5 & 0xffffffff));
      auVar39._4_4_ = auVar39._8_4_;
      auVar39._0_4_ = auVar29._0_4_;
      auVar39._12_4_ = (int)((ulong)auVar36._12_4_ * (uVar5 & 0xffffffff));
      auVar29._8_8_ = auVar39._8_8_;
      auVar29._4_4_ = (int)((ulong)auVar36._4_4_ * (uVar5 & 0xffffffff));
      lVar12 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 4;
      auVar28._8_8_ = lVar12 + 4;
      lVar12 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 4;
      auVar27._8_8_ = lVar12 + 4;
      lVar8 = lVar8 + 0x10;
    } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar8);
    auVar30._0_4_ = uVar31 & uVar22;
    auVar30._4_4_ = uVar32 & uVar25;
    auVar30._8_4_ = uVar34 & auVar33._0_4_;
    auVar30._12_4_ = uVar35 & auVar33._8_4_;
    auVar23._4_4_ = iVar26;
    auVar23._0_4_ = uVar24;
    auVar23._8_4_ = auVar33._4_4_;
    auVar23._12_4_ = auVar33._12_4_;
    auVar23 = ~(auVar23 | auVar30) & auVar29 | auVar36 & (auVar23 | auVar30);
    uVar7 = ((ulong)auVar23._8_4_ * (ulong)auVar23._0_4_ & 0xffffffff) *
            ((ulong)auVar23._4_4_ * (ulong)auVar23._12_4_ & 0xffffffff);
    uVar10 = uVar7 & 0xffffffff;
    JVar17 = (JDIMENSION)uVar7;
    if (0 < (int)uVar1) {
      bVar15 = true;
      uVar7 = 0;
LAB_0027a1cd:
      do {
        iVar13 = (int)uVar7;
        if (cinfo->out_color_space == JCS_RGB) {
          iVar13 = (&select_ncolors_RGB_order)[uVar7];
        }
        iVar21 = *(int *)((long)&pjVar4[1].new_color_map + (long)iVar13 * 4 + 4);
        lVar8 = (long)iVar21 + 1;
        uVar5 = ((int)uVar10 / iVar21) * lVar8;
        if (uVar5 - lVar18 == 0 || (long)uVar5 < lVar18) {
          *(int *)((long)&pjVar4[1].new_color_map + (long)iVar13 * 4 + 4) = (int)lVar8;
          uVar7 = uVar7 + 1;
          bVar15 = false;
          uVar10 = uVar5 & 0xffffffff;
          if (uVar7 != uVar1) goto LAB_0027a1cd;
        }
        JVar17 = (JDIMENSION)uVar10;
        uVar7 = 0;
        bVar3 = !bVar15;
        bVar15 = true;
      } while (bVar3);
    }
  }
  iVar13 = cinfo->out_color_components;
  pjVar2 = cinfo->err;
  (pjVar2->msg_parm).i[0] = JVar17;
  if (iVar13 == 3) {
    (pjVar2->msg_parm).i[1] = *(int *)((long)&pjVar4[1].new_color_map + 4);
    (pjVar2->msg_parm).i[2] = *(int *)&pjVar4[2].start_pass;
    (pjVar2->msg_parm).i[3] = *(int *)((long)&pjVar4[2].start_pass + 4);
    iVar13 = 0x60;
    pjVar9 = pjVar2;
  }
  else {
    pjVar9 = cinfo->err;
    iVar13 = 0x61;
  }
  pjVar2->msg_code = iVar13;
  (*pjVar9->emit_message)((j_common_ptr)cinfo,1);
  ppJVar6 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,JVar17,cinfo->out_color_components);
  iVar13 = cinfo->out_color_components;
  if (0 < iVar13) {
    lVar18 = 0;
    JVar16 = JVar17;
    do {
      iVar21 = *(int *)((long)&pjVar4[1].new_color_map + lVar18 * 4 + 4);
      JVar14 = (JDIMENSION)((long)(int)JVar16 / (long)iVar21);
      if (0 < (long)iVar21) {
        lVar8 = 0;
        lVar12 = 0;
        do {
          if (lVar8 * (int)JVar14 < (long)(int)JVar17) {
            lVar11 = lVar12;
            do {
              if (0 < (int)JVar14) {
                uVar10 = 0;
                do {
                  ppJVar6[lVar18][uVar10 + lVar11] =
                       (JSAMPLE)((lVar8 * 0xff + (ulong)(iVar21 - 1U >> 1)) / (ulong)(iVar21 - 1U));
                  uVar10 = uVar10 + 1;
                } while (((long)(int)JVar16 / (long)iVar21 & 0xffffffffU) != uVar10);
              }
              lVar11 = lVar11 + (int)JVar16;
            } while (lVar11 < (int)JVar17);
          }
          lVar8 = lVar8 + 1;
          lVar12 = lVar12 + (int)JVar14;
        } while (lVar8 != iVar21);
        iVar13 = cinfo->out_color_components;
      }
      lVar18 = lVar18 + 1;
      JVar16 = JVar14;
    } while (lVar18 < iVar13);
  }
  pjVar4[1].start_pass = (_func_void_j_decompress_ptr_boolean *)ppJVar6;
  *(JDIMENSION *)&pjVar4[1].color_quantize = JVar17;
  create_colorindex(cinfo);
  if (cinfo->dither_mode != JDITHER_FS) {
    return;
  }
  alloc_fs_workspace(cinfo);
  return;
}

Assistant:

GLOBAL(void)
jinit_1pass_quantizer (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize;

  cquantize = (my_cquantize_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_cquantizer));
  cinfo->cquantize = (struct jpeg_color_quantizer *) cquantize;
  cquantize->pub.start_pass = start_pass_1_quant;
  cquantize->pub.finish_pass = finish_pass_1_quant;
  cquantize->pub.new_color_map = new_color_map_1_quant;
  cquantize->fserrors[0] = NULL; /* Flag FS workspace not allocated */
  cquantize->odither[0] = NULL;	/* Also flag odither arrays not allocated */

  /* Make sure my internal arrays won't overflow */
  if (cinfo->out_color_components > MAX_Q_COMPS)
    ERREXIT1(cinfo, JERR_QUANT_COMPONENTS, MAX_Q_COMPS);
  /* Make sure colormap indexes can be represented by JSAMPLEs */
  if (cinfo->desired_number_of_colors > (MAXJSAMPLE+1))
    ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXJSAMPLE+1);

  /* Create the colormap and color index table. */
  create_colormap(cinfo);
  create_colorindex(cinfo);

  /* Allocate Floyd-Steinberg workspace now if requested.
   * We do this now since it is FAR storage and may affect the memory
   * manager's space calculations.  If the user changes to FS dither
   * mode in a later pass, we will allocate the space then, and will
   * possibly overrun the max_memory_to_use setting.
   */
  if (cinfo->dither_mode == JDITHER_FS)
    alloc_fs_workspace(cinfo);
}